

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_resorting(uint N_trials,uint list_size)

{
  int iVar1;
  time_t tVar2;
  ulong uVar3;
  int *data;
  ostream *poVar4;
  uint local_44;
  uint local_40;
  uint i_1;
  uint k;
  undefined1 local_30 [8];
  sorted_ptr_arr<int> sorted_data;
  uint i;
  int *test_input;
  uint list_size_local;
  uint N_trials_local;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  uVar3 = SUB168(ZEXT416(list_size) * ZEXT816(4),0);
  if (SUB168(ZEXT416(list_size) * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  data = (int *)operator_new__(uVar3);
  for (sorted_data.N._4_4_ = 0; sorted_data.N._4_4_ < list_size;
      sorted_data.N._4_4_ = sorted_data.N._4_4_ + 1) {
    iVar1 = rand();
    data[sorted_data.N._4_4_] = (int)(((double)iVar1 * 100.0) / 2147483647.0);
  }
  sorted_ptr_arr<int>::sorted_ptr_arr((sorted_ptr_arr<int> *)local_30,data,(ulong)list_size);
  poVar4 = std::operator<<((ostream *)&std::cout,"Sorting nearly-ordered list of ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,list_size);
  poVar4 = std::operator<<(poVar4," integers ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,N_trials);
  std::operator<<(poVar4," times...");
  for (local_40 = 0; local_40 < N_trials; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < list_size; local_44 = local_44 + 1) {
      iVar1 = rand();
      data[local_44] = (int)(((double)iVar1 * 3.0) / 2147483647.0) + data[local_44];
    }
    sorted_ptr_arr<int>::sort((sorted_ptr_arr<int> *)local_30);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Done.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if (data != (int *)0x0) {
    operator_delete__(data);
  }
  sorted_ptr_arr<int>::~sorted_ptr_arr((sorted_ptr_arr<int> *)local_30);
  return;
}

Assistant:

void test_resorting(unsigned int N_trials, unsigned int list_size) {
	srand(time(NULL));
	
	int* test_input = new int[list_size];
	for(unsigned int i=0; i<list_size; i++) { test_input[i] = (int)(100*(double)rand()/(double)RAND_MAX); }
	sorted_ptr_arr<int> sorted_data(&test_input[0], list_size);
	
	std::cout << "Sorting nearly-ordered list of " << list_size << " integers " << N_trials << " times..."; 
	for(unsigned int k=0; k<N_trials; k++) {
		for(unsigned int i=0; i<list_size; i++) { test_input[i] += (int)(3*(double)rand()/(double)RAND_MAX); }
		sorted_data.sort();
	}
	std::cout << "Done." << std::endl;
	
	delete[] test_input;
}